

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O1

void ncnn::transpose_pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  size_t *psVar18;
  undefined1 (*pauVar19) [32];
  ulong uVar20;
  ulong uVar21;
  undefined4 *puVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  undefined1 (*pauVar27) [16];
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [32];
  long lVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  
  iVar1 = A->elempack;
  psVar18 = (size_t *)&A->w;
  if (A->dims == 3) {
    psVar18 = &A->cstep;
  }
  iVar2 = (int)*psVar18;
  pauVar19 = (undefined1 (*) [32])AT->data;
  uVar31 = 0;
  lVar24 = (long)iVar2;
  lVar29 = (long)i;
  if (7 < max_ii) {
    lVar26 = (long)(iVar2 * k);
    lVar30 = lVar29 * 0x20 + lVar26 * 4 + 0xe0;
    lVar23 = lVar29 * 0x10 + lVar26 * 4 + 0x70;
    lVar26 = lVar26 * 4 + lVar29 * 4;
    uVar20 = 0;
    do {
      if (7 < max_kk && iVar1 == 8) {
        pauVar32 = (undefined1 (*) [32])((long)A->data + lVar30);
        iVar25 = 7;
        do {
          auVar15 = vunpcklps_avx(pauVar32[-7],pauVar32[-6]);
          auVar9 = vunpckhps_avx(pauVar32[-7],pauVar32[-6]);
          auVar16 = vunpcklps_avx(pauVar32[-5],pauVar32[-4]);
          auVar35 = vunpckhps_avx(pauVar32[-5],pauVar32[-4]);
          auVar17 = vunpcklps_avx(pauVar32[-3],pauVar32[-2]);
          auVar34 = vunpckhps_avx(pauVar32[-3],pauVar32[-2]);
          auVar37 = vunpcklps_avx(pauVar32[-1],*pauVar32);
          auVar10 = vunpckhps_avx(pauVar32[-1],*pauVar32);
          auVar36 = vunpcklpd_avx(auVar15,auVar16);
          auVar15 = vunpckhpd_avx(auVar15,auVar16);
          auVar16 = vunpcklpd_avx(auVar9,auVar35);
          auVar9 = vunpckhpd_avx(auVar9,auVar35);
          auVar11 = vunpcklpd_avx(auVar17,auVar37);
          auVar35 = vunpckhpd_avx(auVar17,auVar37);
          auVar17 = vunpcklpd_avx(auVar34,auVar10);
          auVar34 = vunpckhpd_avx(auVar34,auVar10);
          auVar37._16_16_ = auVar11._0_16_;
          auVar37._0_16_ = auVar36._0_16_;
          auVar38._16_16_ = auVar35._0_16_;
          auVar38._0_16_ = auVar15._0_16_;
          auVar39._16_16_ = auVar17._0_16_;
          auVar39._0_16_ = auVar16._0_16_;
          auVar40._16_16_ = auVar34._0_16_;
          auVar40._0_16_ = auVar9._0_16_;
          auVar10 = vperm2f128_avx(auVar36,auVar11,0x31);
          auVar15 = vperm2f128_avx(auVar15,auVar35,0x31);
          auVar35 = vperm2f128_avx(auVar16,auVar17,0x31);
          auVar9 = vperm2f128_avx(auVar9,auVar34,0x31);
          *pauVar19 = auVar37;
          pauVar19[1] = auVar38;
          pauVar19[2] = auVar39;
          pauVar19[3] = auVar40;
          pauVar19[4] = auVar10;
          pauVar19[5] = auVar15;
          pauVar19[6] = auVar35;
          pauVar19[7] = auVar9;
          pauVar19 = pauVar19 + 8;
          pauVar32 = (undefined1 (*) [32])(*pauVar32 + (long)(iVar2 * 8) * 4);
          iVar25 = iVar25 + 8;
        } while (iVar25 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar27 = (undefined1 (*) [16])((long)A->data + lVar23);
        iVar25 = 3;
        do {
          auVar12 = vunpcklps_avx(pauVar27[-7],pauVar27[-6]);
          auVar13 = vunpcklps_avx(pauVar27[-5],pauVar27[-4]);
          auVar5 = vunpckhps_avx(pauVar27[-7],pauVar27[-6]);
          auVar6 = vunpckhps_avx(pauVar27[-5],pauVar27[-4]);
          auVar3 = vmovlhps_avx(auVar12,auVar13);
          auVar13 = vunpckhpd_avx(auVar12,auVar13);
          auVar12 = vmovlhps_avx(auVar5,auVar6);
          auVar4 = vunpckhpd_avx(auVar5,auVar6);
          auVar6 = vunpcklps_avx(pauVar27[-3],pauVar27[-2]);
          auVar14 = vunpcklps_avx(pauVar27[-1],*pauVar27);
          auVar7 = vunpckhps_avx(pauVar27[-3],pauVar27[-2]);
          auVar8 = vunpckhps_avx(pauVar27[-1],*pauVar27);
          auVar5 = vmovlhps_avx(auVar6,auVar14);
          auVar14 = vunpckhpd_avx(auVar6,auVar14);
          auVar6 = vmovlhps_avx(auVar7,auVar8);
          auVar7 = vunpckhpd_avx(auVar7,auVar8);
          *(undefined1 (*) [16])*pauVar19 = auVar3;
          *(undefined1 (*) [16])(*pauVar19 + 0x10) = auVar5;
          *(undefined1 (*) [16])pauVar19[1] = auVar13;
          *(undefined1 (*) [16])(pauVar19[1] + 0x10) = auVar14;
          *(undefined1 (*) [16])pauVar19[2] = auVar12;
          *(undefined1 (*) [16])(pauVar19[2] + 0x10) = auVar6;
          *(undefined1 (*) [16])pauVar19[3] = auVar4;
          *(undefined1 (*) [16])(pauVar19[3] + 0x10) = auVar7;
          pauVar19 = pauVar19 + 4;
          pauVar27 = (undefined1 (*) [16])(*pauVar27 + (long)(iVar2 * 4) * 4);
          iVar25 = iVar25 + 4;
        } while (iVar25 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        pauVar32 = (undefined1 (*) [32])((long)A->data + lVar26);
        iVar25 = max_kk;
        do {
          *pauVar19 = *pauVar32;
          pauVar19 = pauVar19 + 1;
          pauVar32 = (undefined1 (*) [32])(*pauVar32 + lVar24 * 4);
          iVar25 = iVar25 + -1;
        } while (iVar25 != 0);
      }
      uVar31 = uVar20 + 8;
      uVar21 = uVar20 + 0xf;
      lVar30 = lVar30 + 0x100;
      lVar23 = lVar23 + 0x80;
      lVar26 = lVar26 + 0x20;
      uVar20 = uVar31;
    } while (uVar21 < (uint)max_ii);
  }
  lVar26 = (long)max_ii;
  if ((int)((uint)uVar31 | 3) < max_ii) {
    lVar23 = (long)(iVar2 * k);
    uVar20 = uVar31 & 0xffffffff;
    lVar33 = (uVar20 + lVar29) * 0x20 + lVar23 * 4 + 0x60;
    lVar30 = (uVar20 + lVar29) * 0x10 + lVar23 * 4 + 0x30;
    lVar23 = lVar23 * 4 + lVar29 * 4 + uVar20 * 4;
    do {
      if (7 < max_kk && iVar1 == 8) {
        pauVar32 = (undefined1 (*) [32])((long)A->data + lVar33);
        iVar25 = 7;
        do {
          auVar15 = vunpcklps_avx(pauVar32[-3],pauVar32[-2]);
          auVar9 = vunpckhps_avx(pauVar32[-3],pauVar32[-2]);
          auVar10 = vunpcklps_avx(pauVar32[-1],*pauVar32);
          auVar35 = vunpckhps_avx(pauVar32[-1],*pauVar32);
          auVar34 = vunpcklpd_avx(auVar15,auVar10);
          auVar15 = vunpckhpd_avx(auVar15,auVar10);
          auVar10 = vunpcklpd_avx(auVar9,auVar35);
          auVar9 = vunpckhpd_avx(auVar9,auVar35);
          auVar35._16_16_ = auVar15._0_16_;
          auVar35._0_16_ = auVar34._0_16_;
          auVar36._16_16_ = auVar9._0_16_;
          auVar36._0_16_ = auVar10._0_16_;
          auVar15 = vperm2f128_avx(auVar34,auVar15,0x31);
          auVar9 = vperm2f128_avx(auVar10,auVar9,0x31);
          *pauVar19 = auVar35;
          pauVar19[1] = auVar36;
          pauVar19[2] = auVar15;
          pauVar19[3] = auVar9;
          pauVar19 = pauVar19 + 4;
          pauVar32 = (undefined1 (*) [32])(*pauVar32 + (long)(iVar2 * 8) * 4);
          iVar25 = iVar25 + 8;
        } while (iVar25 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar27 = (undefined1 (*) [16])((long)A->data + lVar30);
        iVar25 = 3;
        do {
          auVar12 = vunpcklps_avx(pauVar27[-3],pauVar27[-2]);
          auVar5 = vunpcklps_avx(pauVar27[-1],*pauVar27);
          auVar6 = vunpckhps_avx(pauVar27[-3],pauVar27[-2]);
          auVar13 = vunpckhps_avx(pauVar27[-1],*pauVar27);
          auVar3 = vmovlhps_avx(auVar12,auVar5);
          auVar5 = vunpckhpd_avx(auVar12,auVar5);
          auVar12 = vmovlhps_avx(auVar6,auVar13);
          auVar6 = vunpckhpd_avx(auVar6,auVar13);
          *(undefined1 (*) [16])*pauVar19 = auVar3;
          *(undefined1 (*) [16])(*pauVar19 + 0x10) = auVar5;
          *(undefined1 (*) [16])pauVar19[1] = auVar12;
          *(undefined1 (*) [16])(pauVar19[1] + 0x10) = auVar6;
          pauVar19 = pauVar19 + 2;
          pauVar27 = (undefined1 (*) [16])(*pauVar27 + (long)(iVar2 * 4) * 4);
          iVar25 = iVar25 + 4;
        } while (iVar25 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        pauVar27 = (undefined1 (*) [16])((long)A->data + lVar23);
        iVar25 = max_kk;
        do {
          *(undefined1 (*) [16])*pauVar19 = *pauVar27;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          pauVar27 = (undefined1 (*) [16])(*pauVar27 + lVar24 * 4);
          iVar25 = iVar25 + -1;
        } while (iVar25 != 0);
      }
      uVar31 = uVar20 + 4;
      lVar28 = uVar20 + 7;
      lVar33 = lVar33 + 0x80;
      lVar30 = lVar30 + 0x40;
      lVar23 = lVar23 + 0x10;
      uVar20 = uVar31;
    } while (lVar28 < lVar26);
  }
  if ((int)((uint)uVar31 | 1) < max_ii) {
    lVar23 = (long)(iVar2 * k);
    uVar20 = uVar31 & 0xffffffff;
    lVar30 = (uVar20 + lVar29) * 0x20 + lVar23 * 4 + 0x20;
    lVar33 = (uVar20 + lVar29) * 0x10 + lVar23 * 4 + 0x10;
    lVar23 = lVar29 * 4 + lVar23 * 4 + uVar20 * 4 + 4;
    do {
      if (7 < max_kk && iVar1 == 8) {
        pauVar32 = (undefined1 (*) [32])((long)A->data + lVar30);
        iVar25 = 7;
        do {
          auVar9 = vunpcklps_avx(pauVar32[-1],*pauVar32);
          auVar15 = vunpckhps_avx(pauVar32[-1],*pauVar32);
          auVar34._16_16_ = auVar15._0_16_;
          auVar34._0_16_ = auVar9._0_16_;
          auVar15 = vperm2f128_avx(auVar9,auVar15,0x31);
          *pauVar19 = auVar34;
          pauVar19[1] = auVar15;
          pauVar19 = pauVar19 + 2;
          iVar25 = iVar25 + 8;
          pauVar32 = (undefined1 (*) [32])(*pauVar32 + (long)(iVar2 * 8) * 4);
        } while (iVar25 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar27 = (undefined1 (*) [16])((long)A->data + lVar33);
        iVar25 = 3;
        do {
          auVar12 = vunpcklps_avx(pauVar27[-1],*pauVar27);
          auVar3 = vunpckhps_avx(pauVar27[-1],*pauVar27);
          *(undefined1 (*) [16])*pauVar19 = auVar12;
          *(undefined1 (*) [16])(*pauVar19 + 0x10) = auVar3;
          pauVar19 = pauVar19 + 1;
          iVar25 = iVar25 + 4;
          pauVar27 = (undefined1 (*) [16])(*pauVar27 + (long)(iVar2 * 4) * 4);
        } while (iVar25 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        puVar22 = (undefined4 *)((long)A->data + lVar23);
        iVar25 = max_kk;
        do {
          *(undefined4 *)*pauVar19 = puVar22[-1];
          *(undefined4 *)(*pauVar19 + 4) = *puVar22;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 8);
          puVar22 = puVar22 + lVar24;
          iVar25 = iVar25 + -1;
        } while (iVar25 != 0);
      }
      uVar31 = uVar20 + 2;
      lVar28 = uVar20 + 3;
      lVar30 = lVar30 + 0x40;
      lVar33 = lVar33 + 0x20;
      lVar23 = lVar23 + 8;
      uVar20 = uVar31;
    } while (lVar28 < lVar26);
  }
  if ((int)uVar31 < max_ii) {
    lVar33 = (long)(k * iVar2);
    lVar28 = (long)(int)uVar31;
    lVar23 = (lVar28 + lVar29) * 0x20 + lVar33 * 4;
    lVar30 = (lVar28 + lVar29) * 0x10 + lVar33 * 4;
    lVar29 = lVar33 * 4 + lVar29 * 4 + lVar28 * 4;
    do {
      if (7 < max_kk && iVar1 == 8) {
        pauVar32 = (undefined1 (*) [32])((long)A->data + lVar23);
        iVar25 = 7;
        do {
          *pauVar19 = *pauVar32;
          pauVar19 = pauVar19 + 1;
          iVar25 = iVar25 + 8;
          pauVar32 = (undefined1 (*) [32])(*pauVar32 + (long)(iVar2 * 8) * 4);
        } while (iVar25 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar27 = (undefined1 (*) [16])((long)A->data + lVar30);
        iVar25 = 3;
        do {
          *(undefined1 (*) [16])*pauVar19 = *pauVar27;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          iVar25 = iVar25 + 4;
          pauVar27 = (undefined1 (*) [16])(*pauVar27 + (long)(iVar2 * 4) * 4);
        } while (iVar25 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        puVar22 = (undefined4 *)((long)A->data + lVar29);
        iVar25 = max_kk;
        do {
          *(undefined4 *)*pauVar19 = *puVar22;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 4);
          puVar22 = puVar22 + lVar24;
          iVar25 = iVar25 + -1;
        } while (iVar25 != 0);
      }
      lVar28 = lVar28 + 1;
      lVar23 = lVar23 + 0x20;
      lVar30 = lVar30 + 0x10;
      lVar29 = lVar29 + 4;
    } while (lVar28 != lVar26);
  }
  return;
}

Assistant:

static void transpose_pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                __m512 _rc = _mm512_load_ps(p0 + 16 * 12);
                __m512 _rd = _mm512_load_ps(p0 + 16 * 13);
                __m512 _re = _mm512_load_ps(p0 + 16 * 14);
                __m512 _rf = _mm512_load_ps(p0 + 16 * 15);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += A_hstep * 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                __m256 _rc = _mm256_load_ps(p0 + 8 * 12);
                __m256 _rd = _mm256_load_ps(p0 + 8 * 13);
                __m256 _re = _mm256_load_ps(p0 + 8 * 14);
                __m256 _rf = _mm256_load_ps(p0 + 8 * 15);

                transpose8x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                __m512 _rr0 = _mm512_insertf32x8(_mm512_castps256_ps512(_r0), _r1, 1);
                __m512 _rr1 = _mm512_insertf32x8(_mm512_castps256_ps512(_r2), _r3, 1);
                __m512 _rr2 = _mm512_insertf32x8(_mm512_castps256_ps512(_r4), _r5, 1);
                __m512 _rr3 = _mm512_insertf32x8(_mm512_castps256_ps512(_r6), _r7, 1);
                __m512 _rr4 = _mm512_insertf32x8(_mm512_castps256_ps512(_r8), _r9, 1);
                __m512 _rr5 = _mm512_insertf32x8(_mm512_castps256_ps512(_ra), _rb, 1);
                __m512 _rr6 = _mm512_insertf32x8(_mm512_castps256_ps512(_rc), _rd, 1);
                __m512 _rr7 = _mm512_insertf32x8(_mm512_castps256_ps512(_re), _rf, 1);

                _mm512_store_ps(pp, _rr0);
                _mm512_store_ps(pp + 16 * 1, _rr1);
                _mm512_store_ps(pp + 16 * 2, _rr2);
                _mm512_store_ps(pp + 16 * 3, _rr3);
                _mm512_store_ps(pp + 16 * 4, _rr4);
                _mm512_store_ps(pp + 16 * 5, _rr5);
                _mm512_store_ps(pp + 16 * 6, _rr6);
                _mm512_store_ps(pp + 16 * 7, _rr7);
                pp += 128;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                __m128 _rc = _mm_load_ps(p0 + 4 * 12);
                __m128 _rd = _mm_load_ps(p0 + 4 * 13);
                __m128 _re = _mm_load_ps(p0 + 4 * 14);
                __m128 _rf = _mm_load_ps(p0 + 4 * 15);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _rc);
                _mm_store_ps(pp + 4 * 4, _r1);
                _mm_store_ps(pp + 4 * 5, _r5);
                _mm_store_ps(pp + 4 * 6, _r9);
                _mm_store_ps(pp + 4 * 7, _rd);
                _mm_store_ps(pp + 4 * 8, _r2);
                _mm_store_ps(pp + 4 * 9, _r6);
                _mm_store_ps(pp + 4 * 10, _ra);
                _mm_store_ps(pp + 4 * 11, _re);
                _mm_store_ps(pp + 4 * 12, _r3);
                _mm_store_ps(pp + 4 * 13, _r7);
                _mm_store_ps(pp + 4 * 14, _rb);
                _mm_store_ps(pp + 4 * 15, _rf);
                pp += 64;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_loadu_ps(p0));
                pp += 16;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += A_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += A_hstep;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += A_hstep;
            }
        }
    }
}